

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::walkPath(Chromosome *this)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  reference pvVar7;
  pair<Coordinate,_Coordinate> local_50;
  ulong local_38;
  size_t j;
  size_t i;
  Coordinate cord2;
  Coordinate cord1;
  Chromosome *this_local;
  
  this->collisions = 0;
  std::
  vector<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>::
  clear(&this->pairs);
  Coordinate::Coordinate((Coordinate *)&cord2.y);
  Coordinate::Coordinate((Coordinate *)&i);
  for (j = 0; sVar2 = j,
      sVar4 = std::vector<Coordinate,_std::allocator<Coordinate>_>::size(&this->pathList),
      sVar2 < sVar4; j = j + 1) {
    pvVar5 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(&this->pathList,j);
    cord2.y = pvVar5->x;
    cord2.facing = pvVar5->y;
    for (local_38 = j + 2; uVar1 = local_38,
        sVar4 = std::vector<Coordinate,_std::allocator<Coordinate>_>::size(&this->pathList),
        uVar1 < sVar4; local_38 = local_38 + 1) {
      pvVar5 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(&this->pathList,local_38);
      i._0_4_ = pvVar5->x;
      i._4_4_ = pvVar5->y;
      cord2.x = pvVar5->facing;
      if (cord2.y == (undefined4)i) {
        if (cord2.facing == i._4_4_) {
          this->collisions = this->collisions + 1;
        }
      }
      pcVar6 = (char *)std::__cxx11::string::at(0x12f3b8);
      if ((*pcVar6 == '1') && (pcVar6 = (char *)std::__cxx11::string::at(0x12f3b8), *pcVar6 != '\0')
         ) {
        pvVar5 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(&this->pathList,j);
        pvVar7 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(&this->pathList,local_38);
        bVar3 = isPair(this,pvVar5,pvVar7);
        if (bVar3) {
          pvVar5 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(&this->pathList,j);
          pvVar7 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at
                             (&this->pathList,local_38);
          std::make_pair<Coordinate,Coordinate>(&local_50,pvVar5,pvVar7);
          std::
          vector<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
          ::push_back(&this->pairs,&local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void Chromosome::walkPath() {

    // reset collisions counter;
    this->collisions = 0;
    pairs.clear();


    Coordinate cord1;
    Coordinate cord2;

    for (size_t i = 0; i < pathList.size(); i++){
        cord1 =  pathList.at(i);
        for(size_t j = i + 2; j < pathList.size(); j++){
            cord2 = pathList.at(j);
            if(cord1.x == cord2.x && cord1.y == cord2.y) {
                collisions++;
            }
            if(GeneticAlgorithm::params.sequence.at(i) == '1' && GeneticAlgorithm::params.sequence.at(j)){
                if (isPair(pathList.at(i), pathList.at(j))){
                    pairs.push_back(std::make_pair<Coordinate, Coordinate>(
                            (Coordinate &&) pathList.at(i),
                            (Coordinate &&) pathList.at(j))
                    );
                }
            }
        }
    }
}